

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result * __thiscall
httplib::Client::Post
          (Result *__return_storage_ptr__,Client *this,string *path,size_t content_length,
          ContentProvider *content_provider,string *content_type)

{
  ContentProvider *content_length_00;
  size_t path_00;
  pointer this_00;
  function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> local_58;
  string *local_38;
  string *content_type_local;
  ContentProvider *content_provider_local;
  size_t content_length_local;
  string *path_local;
  Client *this_local;
  
  local_38 = content_type;
  content_type_local = (string *)content_provider;
  content_provider_local = (ContentProvider *)content_length;
  content_length_local = (size_t)path;
  path_local = (string *)this;
  this_local = (Client *)__return_storage_ptr__;
  this_00 = std::unique_ptr<httplib::ClientImpl,_std::default_delete<httplib::ClientImpl>_>::
            operator->(&this->cli_);
  path_00 = content_length_local;
  content_length_00 = content_provider_local;
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::function
            (&local_58,content_provider);
  ClientImpl::Post(__return_storage_ptr__,this_00,(string *)path_00,(size_t)content_length_00,
                   &local_58,local_38);
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::~function(&local_58);
  return __return_storage_ptr__;
}

Assistant:

inline Result Client::Post(const std::string &path, size_t content_length,
                           ContentProvider content_provider,
                           const std::string &content_type) {
  return cli_->Post(path, content_length, std::move(content_provider),
                    content_type);
}